

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O1

void EDLines::EnumerateRectPoints
               (double sx,double sy,double ex,double ey,int *ptsx,int *ptsy,int *pNoPoints)

{
  double __x;
  int iVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double vy [4];
  double vx [4];
  double vyTmp [4];
  double vxTmp [4];
  double local_e8 [4];
  double local_c8 [4];
  double local_a8 [4];
  double local_88 [4];
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  
  dVar13 = ex - sx;
  dVar12 = ey - sy;
  dVar14 = dVar13 * dVar13 + dVar12 * dVar12;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  dVar12 = (dVar12 / dVar14 + dVar12 / dVar14) * 0.5;
  local_88[0] = sx - dVar12;
  dVar14 = (dVar13 / dVar14 + dVar13 / dVar14) * 0.5;
  local_a8[0] = dVar14 + sy;
  local_88[1] = ex - dVar12;
  local_a8[1] = dVar14 + ey;
  local_88[2] = dVar12 + ex;
  local_a8[2] = ey - dVar14;
  local_88[3] = dVar12 + sx;
  local_a8[3] = sy - dVar14;
  if ((ex <= sx) || (ey < sy)) {
    if ((sx < ex) || (iVar1 = 1, ey <= sy)) {
      iVar1 = (sx <= ex || sy < ey) + 2;
    }
  }
  else {
    iVar1 = 0;
  }
  lVar2 = 0;
  do {
    uVar3 = (ulong)((iVar1 + (int)lVar2 & 3U) << 3);
    local_c8[lVar2] = *(double *)((long)local_88 + uVar3);
    local_e8[lVar2] = *(double *)((long)local_a8 + uVar3);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  dVar14 = ceil(local_c8[0]);
  iVar4 = (int)dVar14 + -1;
  dVar14 = ceil(local_e8[0]);
  iVar1 = (int)dVar14;
  local_38 = ABS(local_c8[3] - local_c8[2]);
  uStack_30 = 0;
  local_48 = ABS(local_c8[0] - local_c8[3]);
  uStack_40 = 0;
  local_58 = ABS(local_c8[1] - local_c8[2]);
  uStack_50 = 0;
  local_68 = ABS(local_c8[0] - local_c8[1]);
  uStack_60 = 0;
  uVar7 = (undefined4)((ulong)local_e8[3] >> 0x20);
  uVar5 = SUB84(local_e8[3],0);
  uVar8 = uVar7;
  if (local_e8[2] <= local_e8[3]) {
    uVar5 = SUB84(local_e8[2],0);
    uVar8 = (undefined4)((ulong)local_e8[2] >> 0x20);
  }
  uVar9 = (undefined4)((ulong)local_e8[0] >> 0x20);
  uVar6 = SUB84(local_e8[0],0);
  uVar10 = uVar9;
  if (local_e8[3] <= local_e8[0]) {
    uVar6 = SUB84(local_e8[3],0);
    uVar10 = uVar7;
  }
  dVar14 = local_e8[2];
  if (local_e8[2] <= local_e8[1]) {
    dVar14 = local_e8[1];
  }
  uVar7 = SUB84(local_e8[1],0);
  uVar11 = (int)((ulong)local_e8[1] >> 0x20);
  if (local_e8[1] <= local_e8[0]) {
    uVar7 = SUB84(local_e8[0],0);
    uVar11 = uVar9;
  }
  lVar2 = 0;
  dVar12 = -1.79769313486232e+308;
  do {
    iVar1 = iVar1 + 1;
    if ((dVar12 < (double)iVar1) && ((double)iVar4 <= local_c8[2])) {
      while( true ) {
        iVar4 = iVar4 + 1;
        dVar13 = (double)iVar4;
        if (local_c8[2] < dVar13) break;
        if (local_c8[3] <= dVar13) {
          if (local_38 <= 0.01) {
            __x = (double)CONCAT44(uVar8,uVar5);
            if (local_e8[3] != local_e8[2]) goto LAB_00118a7a;
            dVar12 = (dVar13 - local_c8[3]) * (ey - local_e8[3]);
          }
          else {
            dVar12 = (dVar13 - local_c8[3]) * (local_e8[2] - local_e8[3]);
          }
          __x = dVar12 / (local_c8[2] - local_c8[3]) + local_e8[3];
        }
        else if ((0.01 < local_48) ||
                (__x = (double)CONCAT44(uVar10,uVar6), local_e8[0] == local_e8[3])) {
          __x = ((dVar13 - local_c8[0]) * (local_e8[3] - local_e8[0])) / (local_c8[3] - local_c8[0])
                + local_e8[0];
        }
LAB_00118a7a:
        if (local_c8[1] <= dVar13) {
          if ((0.01 < local_58) || (dVar12 = dVar14, local_e8[1] == local_e8[2])) {
            dVar12 = ((dVar13 - local_c8[1]) * (local_e8[2] - local_e8[1])) /
                     (local_c8[2] - local_c8[1]) + local_e8[1];
          }
        }
        else if ((0.01 < local_68) ||
                (dVar12 = (double)CONCAT44(uVar11,uVar7), local_e8[0] == local_e8[1])) {
          dVar12 = ((dVar13 - local_c8[0]) * (local_e8[1] - local_e8[0])) /
                   (local_c8[1] - local_c8[0]) + local_e8[0];
        }
        dVar13 = ceil(__x);
        iVar1 = (int)dVar13;
        if (((double)(int)dVar13 <= dVar12) || (local_c8[2] < (double)iVar4)) break;
      }
    }
    if (local_c8[2] < (double)iVar4) {
      *pNoPoints = (int)lVar2;
      return;
    }
    ptsx[lVar2] = iVar4;
    ptsy[lVar2] = iVar1;
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void EDLines::EnumerateRectPoints(double sx, double sy, double ex, double ey, int ptsx[], int ptsy[], int * pNoPoints)
{
	double vxTmp[4], vyTmp[4];
	double vx[4], vy[4];
	int n, offset;

	double x1 = sx;
	double y1 = sy;
	double x2 = ex;
	double y2 = ey;
	double width = 2;

	double dx = x2 - x1;
	double dy = y2 - y1;
	double vLen = sqrt(dx*dx + dy*dy);

	// make unit vector
	dx = dx / vLen;
	dy = dy / vLen;

	/* build list of rectangle corners ordered
	in a circular way around the rectangle */
	vxTmp[0] = x1 - dy * width / 2.0;
	vyTmp[0] = y1 + dx * width / 2.0;
	vxTmp[1] = x2 - dy * width / 2.0;
	vyTmp[1] = y2 + dx * width / 2.0;
	vxTmp[2] = x2 + dy * width / 2.0;
	vyTmp[2] = y2 - dx * width / 2.0;
	vxTmp[3] = x1 + dy * width / 2.0;
	vyTmp[3] = y1 - dx * width / 2.0;

	/* compute rotation of index of corners needed so that the first
	point has the smaller x.

	if one side is vertical, thus two corners have the same smaller x
	value, the one with the largest y value is selected as the first.
	*/
	if (x1 < x2 && y1 <= y2) offset = 0;
	else if (x1 >= x2 && y1 < y2) offset = 1;
	else if (x1 > x2 && y1 >= y2) offset = 2;
	else                          offset = 3;

	/* apply rotation of index. */
	for (n = 0; n<4; n++) {
		vx[n] = vxTmp[(offset + n) % 4];
		vy[n] = vyTmp[(offset + n) % 4];
	} //end-for

	  /* Set a initial condition.

	  The values are set to values that will cause 'ri_inc' (that will
	  be called immediately) to initialize correctly the first 'column'
	  and compute the limits 'ys' and 'ye'.

	  'y' is set to the integer value of vy[0], the starting corner.

	  'ys' and 'ye' are set to very small values, so 'ri_inc' will
	  notice that it needs to start a new 'column'.

	  The smaller integer coordinate inside of the rectangle is
	  'ceil(vx[0])'. The current 'x' value is set to that value minus
	  one, so 'ri_inc' (that will increase x by one) will advance to
	  the first 'column'.
	  */
	int x = (int)ceil(vx[0]) - 1;
	int y = (int)ceil(vy[0]);
	double ys = -DBL_MAX, ye = -DBL_MAX;

	int noPoints = 0;
	while (1) {
		/* if not at end of exploration,
		increase y value for next pixel in the 'column' */
		y++;

		/* if the end of the current 'column' is reached,
		and it is not the end of exploration,
		advance to the next 'column' */
		while (y > ye && x <= vx[2]) {
			/* increase x, next 'column' */
			x++;

			/* if end of exploration, return */
			if (x > vx[2]) break;

			/* update lower y limit (start) for the new 'column'.

			We need to interpolate the y value that corresponds to the
			lower side of the rectangle. The first thing is to decide if
			the corresponding side is

			vx[0],vy[0] to vx[3],vy[3] or
			vx[3],vy[3] to vx[2],vy[2]

			Then, the side is interpolated for the x value of the
			'column'. But, if the side is vertical (as it could happen if
			the rectangle is vertical and we are dealing with the first
			or last 'columns') then we pick the lower value of the side
			by using 'inter_low'.
			*/
			if ((double)x < vx[3]) {
				/* interpolation */
				if (fabs(vx[0] - vx[3]) <= 0.01) {
					if (vy[0]<vy[3]) ys = vy[0];
					else if (vy[0]>vy[3]) ys = vy[3];
					else     ys = vy[0] + (x - vx[0]) * (vy[3] - vy[0]) / (vx[3] - vx[0]);
				}
				else
					ys = vy[0] + (x - vx[0]) * (vy[3] - vy[0]) / (vx[3] - vx[0]);

			}
			else {
				/* interpolation */
				if (fabs(vx[3] - vx[2]) <= 0.01) {
					if (vy[3]<vy[2]) ys = vy[3];
					else if (vy[3]>vy[2]) ys = vy[2];
					else     ys = vy[3] + (x - vx[3]) * (y2 - vy[3]) / (vx[2] - vx[3]);
				}
				else
					ys = vy[3] + (x - vx[3]) * (vy[2] - vy[3]) / (vx[2] - vx[3]);
			} //end-else

			  /* update upper y limit (end) for the new 'column'.

			  We need to interpolate the y value that corresponds to the
			  upper side of the rectangle. The first thing is to decide if
			  the corresponding side is

			  vx[0],vy[0] to vx[1],vy[1] or
			  vx[1],vy[1] to vx[2],vy[2]

			  Then, the side is interpolated for the x value of the
			  'column'. But, if the side is vertical (as it could happen if
			  the rectangle is vertical and we are dealing with the first
			  or last 'columns') then we pick the lower value of the side
			  by using 'inter_low'.
			  */
			if ((double)x < vx[1]) {
				/* interpolation */
				if (fabs(vx[0] - vx[1]) <= 0.01) {
					if (vy[0]<vy[1]) ye = vy[1];
					else if (vy[0]>vy[1]) ye = vy[0];
					else     ye = vy[0] + (x - vx[0]) * (vy[1] - vy[0]) / (vx[1] - vx[0]);
				}
				else
					ye = vy[0] + (x - vx[0]) * (vy[1] - vy[0]) / (vx[1] - vx[0]);

			}
			else {
				/* interpolation */
				if (fabs(vx[1] - vx[2]) <= 0.01) {
					if (vy[1]<vy[2]) ye = vy[2];
					else if (vy[1]>vy[2]) ye = vy[1];
					else     ye = vy[1] + (x - vx[1]) * (vy[2] - vy[1]) / (vx[2] - vx[1]);
				}
				else
					ye = vy[1] + (x - vx[1]) * (vy[2] - vy[1]) / (vx[2] - vx[1]);
			} //end-else

			  /* new y */
			y = (int)ceil(ys);
		} //end-while

		  // Are we done?
		if (x > vx[2]) break;

		ptsx[noPoints] = x;
		ptsy[noPoints] = y;
		noPoints++;
	} //end-while

	*pNoPoints = noPoints;
}